

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O0

void absl::lts_20250127::internal_any_invocable::
     RemoteInvoker<false,void,google::protobuf::compiler::cpp::FileGenerator::GenerateSource(google::protobuf::io::Printer*)::__0&,google::protobuf::io::Printer*>
               (TypeErasedState *state,ForwardedParameterType<google::protobuf::io::Printer_*> args)

{
  ForwardedParameterType<google::protobuf::io::Printer_*> local_28;
  type *local_20;
  RawT *f;
  ForwardedParameterType<google::protobuf::io::Printer_*> args_local;
  TypeErasedState *state_local;
  
  local_20 = (type *)(state->remote).target;
  local_28 = args;
  f = (RawT *)args;
  args_local = (ForwardedParameterType<google::protobuf::io::Printer_*>)state;
  InvokeR<void,google::protobuf::compiler::cpp::FileGenerator::GenerateSource(google::protobuf::io::Printer*)::__0&,google::protobuf::io::Printer*,void>
            (local_20,&local_28);
  return;
}

Assistant:

ReturnType RemoteInvoker(
    TypeErasedState* const state,
    ForwardedParameterType<P>... args) noexcept(SigIsNoexcept) {
  using RawT = RemoveCVRef<QualTRef>;
  static_assert(!IsStoredLocally<RawT>::value,
                "Target object must be in remote storage in order to be "
                "invoked from it.");

  auto& f = *static_cast<RawT*>(state->remote.target);
  return (InvokeR<ReturnType>)(static_cast<QualTRef>(f),
                               static_cast<ForwardedParameterType<P>>(args)...);
}